

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

bool __thiscall Js::FunctionBody::DoInterpreterAutoProfile(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  LocalFunctionId functionId;
  undefined4 *puVar3;
  byte local_21;
  FunctionBody *this_local;
  
  bVar2 = DoInterpreterProfile(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1c1f,"(DoInterpreterProfile())","DoInterpreterProfile()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = ParseableFunctionInfo::GetIsAsmjsMode(&this->super_ParseableFunctionInfo);
  if (bVar2) {
    this_local._7_1_ = false;
  }
  else {
    sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)this);
    functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
    bVar2 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,InterpreterAutoProfilePhase,sourceContextId,
                              functionId);
    local_21 = 0;
    if (!bVar2) {
      bVar2 = FunctionProxy::IsInDebugMode((FunctionProxy *)this);
      local_21 = bVar2 ^ 0xff;
    }
    this_local._7_1_ = (bool)(local_21 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool FunctionBody::DoInterpreterAutoProfile() const
    {
        Assert(DoInterpreterProfile());

#ifdef ASMJS_PLAT
        if (this->GetIsAsmjsMode()) return false;
#endif

        return !PHASE_OFF(InterpreterAutoProfilePhase, this) && !this->IsInDebugMode();
    }